

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterestCalculator.c
# Opt level: O0

int main(void)

{
  float local_18;
  float interest;
  float principal;
  float rate;
  int term;
  
  rate = 0.0;
  principal = 0.0;
  interest = 0.0;
  local_18 = 0.0;
  printf("%s","Enter loan principal (-1 to end): ");
  __isoc99_scanf("%f",&local_18);
  while( true ) {
    if ((local_18 == -1.0) && (!NAN(local_18))) break;
    printf("%s","Enter interest rate: ");
    __isoc99_scanf("%f",&interest);
    printf("%s","Enter term of the loan in days: ");
    __isoc99_scanf("%d",&principal);
    printf("%s %0.2f\n\n",(double)(local_18 * interest * ((float)(int)principal / 365.0)),
           "The interest charge is $");
    printf("%s","Enter loan principal (-1 to end): ");
    __isoc99_scanf("%f",&local_18);
  }
  return 0;
}

Assistant:

int main (void) {
    int term = 0;
    float rate = 0;
    float principal = 0;
    float interest = 0;

    printf("%s", "Enter loan principal (-1 to end): ");
    scanf("%f", &principal);
    while (principal != -1) {
        printf("%s", "Enter interest rate: ");
        scanf("%f", &rate);
        printf("%s", "Enter term of the loan in days: ");
        scanf("%d", &term);

        interest = principal * rate * ((float)term/365);
        printf("%s %0.2f\n\n", "The interest charge is $", interest);

        printf("%s", "Enter loan principal (-1 to end): ");
        scanf("%f", &principal);

    }

    return 0;

}